

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_shape_values(parser *p)

{
  bool bVar1;
  errr eVar2;
  errr eVar3;
  parser_error pVar4;
  char *pcVar5;
  int16_t *value_00;
  wchar_t index;
  wchar_t value;
  int local_48;
  int local_44;
  char *local_40;
  void *local_38;
  
  local_38 = parser_priv(p);
  if (local_38 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar5 = parser_getstr(p,"values");
    local_40 = string_make(pcVar5);
    pcVar5 = strtok(local_40," |");
    value_00 = (int16_t *)((long)local_38 + 0x58);
    do {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
        break;
      }
      local_44 = 0;
      local_48 = 0;
      eVar2 = grab_int_value(value_00,obj_mods,pcVar5);
      eVar3 = grab_index_and_int(&local_44,&local_48,list_element_names,"RES_",pcVar5);
      if (eVar3 == 0) {
        *(short *)((long)local_38 + (long)local_48 * 4 + 0x90) = 100 - (short)local_44;
LAB_00168b19:
        pcVar5 = strtok((char *)0x0," |");
        bVar1 = true;
      }
      else {
        if (eVar2 == 0) goto LAB_00168b19;
        bVar1 = false;
      }
    } while (bVar1);
    string_free(local_40);
    pVar4 = PARSE_ERROR_INVALID_VALUE;
    if (pcVar5 == (char *)0x0) {
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_shape_values(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	char *s;
	char *t;

	if (!shape)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_int_value(shape->modifiers, obj_mods, t))
			found = true;
		if (!grab_index_and_int(&value, &index, list_element_names, "RES_", t)) {
			found = true;
			shape->el_info[index].res_level = RES_LEVEL_BASE - value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}